

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corruption_test.cc
# Opt level: O1

void __thiscall leveldb::_Test_CorruptedDescriptor::_Run(_Test_CorruptedDescriptor *this)

{
  DBImpl *this_00;
  Status s;
  string v;
  undefined1 local_228 [16];
  Status local_218;
  Comparator *local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  char *local_1e8;
  Cache *pCStack_1e0;
  undefined1 local_1d0 [8];
  Tester local_1c8;
  
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x124;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_228[0] = 0;
  local_208._M_dataplus._M_p = "foo";
  local_208._M_string_length = 3;
  local_1e8 = "hello";
  pCStack_1e0 = (Cache *)0x5;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[2])(&local_218);
  test::Tester::IsOk(&local_1c8,&local_218);
  if (local_218.state_ != (char *)0x0) {
    operator_delete__(local_218.state_);
  }
  test::Tester::~Tester(&local_1c8);
  this_00 = (DBImpl *)(this->super_CorruptionTest).db_;
  DBImpl::TEST_CompactMemTable((DBImpl *)local_1d0);
  if (local_1d0 != (undefined1  [8])0x0) {
    operator_delete__((void *)local_1d0);
  }
  DBImpl::TEST_CompactRange(this_00,0,(Slice *)0x0,(Slice *)0x0);
  CorruptionTest::Corrupt(&this->super_CorruptionTest,kDescriptorFile,0,1000);
  CorruptionTest::TryReopen((CorruptionTest *)local_228);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 299;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  test::Tester::Is(&local_1c8,CONCAT71(local_228._1_7_,local_228[0]) != 0,"!s.ok()");
  test::Tester::~Tester(&local_1c8);
  CorruptionTest::RepairDB(&this->super_CorruptionTest);
  CorruptionTest::Reopen(&this->super_CorruptionTest);
  local_208._M_string_length = 0;
  local_208.field_2._M_local_buf[0] = '\0';
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x130;
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  local_1e8 = (char *)0x100;
  pCStack_1e0 = (Cache *)0x0;
  local_218.state_ = "foo";
  local_210 = (Comparator *)0x3;
  (*((this->super_CorruptionTest).db_)->_vptr_DB[5])(local_228 + 8);
  test::Tester::IsOk(&local_1c8,(Status *)(local_228 + 8));
  if ((Env *)local_228._8_8_ != (Env *)0x0) {
    operator_delete__((void *)local_228._8_8_);
  }
  test::Tester::~Tester(&local_1c8);
  local_1c8.ok_ = true;
  local_1c8.fname_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/corruption_test.cc"
  ;
  local_1c8.line_ = 0x131;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1c8.ss_);
  test::Tester::IsEq<char[6],std::__cxx11::string>(&local_1c8,(char (*) [6])"hello",&local_208);
  test::Tester::~Tester(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((void *)CONCAT71(local_228._1_7_,local_228[0]) != (void *)0x0) {
    operator_delete__((void *)CONCAT71(local_228._1_7_,local_228[0]));
  }
  return;
}

Assistant:

TEST(CorruptionTest, CorruptedDescriptor) {
  ASSERT_OK(db_->Put(WriteOptions(), "foo", "hello"));
  DBImpl* dbi = reinterpret_cast<DBImpl*>(db_);
  dbi->TEST_CompactMemTable();
  dbi->TEST_CompactRange(0, nullptr, nullptr);

  Corrupt(kDescriptorFile, 0, 1000);
  Status s = TryReopen();
  ASSERT_TRUE(!s.ok());

  RepairDB();
  Reopen();
  std::string v;
  ASSERT_OK(db_->Get(ReadOptions(), "foo", &v));
  ASSERT_EQ("hello", v);
}